

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O3

Split * __thiscall
embree::sse2::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::sse2::GridRecalculatePrimRef,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeafGrid<4>,_embree::Scene::BuildProgressMonitorInterface>
::findFallback(Split *__return_storage_ptr__,
              BuilderT<embree::NodeRefPtr<4>,_embree::sse2::GridRecalculatePrimRef,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeafGrid<4>,_embree::Scene::BuildProgressMonitorInterface>
              *this,SetMB *set)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  ulong uVar4;
  PrimRefMB *pPVar5;
  uint uVar6;
  float *pfVar7;
  ulong uVar8;
  long lVar9;
  BBox1f *pBVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  uVar3 = (set->super_PrimInfoMB).object_range._begin;
  uVar4 = (set->super_PrimInfoMB).object_range._end;
  if (uVar4 == uVar3) {
LAB_00c9a410:
    uVar6 = 1;
    fVar11 = 0.0;
    lVar9 = uVar4 - uVar3;
    if ((uVar4 < uVar3 || lVar9 == 0) || ((this->cfg).singleLeafTimeSegment == false))
    goto LAB_00c9a579;
    fVar1 = (set->super_PrimInfoMB).time_range.lower;
    fVar2 = (set->super_PrimInfoMB).time_range.upper;
    pBVar10 = &set->prims->items[uVar3].time_range;
    do {
      fVar11 = (*pBVar10).lower;
      fVar15 = (float)(uint)pBVar10[-1].upper;
      fVar14 = (*pBVar10).upper - fVar11;
      fVar12 = floorf(((fVar1 - fVar11) / fVar14) * 1.0000002 * fVar15);
      fVar13 = 0.0;
      if (0.0 <= fVar12) {
        fVar13 = fVar12;
      }
      fVar12 = ceilf(((fVar2 - fVar11) / fVar14) * 0.99999976 * fVar15);
      if (fVar15 <= fVar12) {
        fVar12 = fVar15;
      }
      if (1 < (int)fVar12 - (int)fVar13) {
        fVar11 = fVar11 + (fVar14 * (float)(((int)fVar12 + (int)fVar13) / 2)) / fVar15;
        uVar6 = 2;
        goto LAB_00c9a579;
      }
      pBVar10 = pBVar10 + 10;
      lVar9 = lVar9 + -1;
      uVar6 = 1;
    } while (lVar9 != 0);
  }
  else {
    pPVar5 = set->prims->items;
    pfVar7 = pPVar5[uVar3 + 1].lbounds.bounds0.lower.field_0.m128 + 3;
    uVar8 = uVar3;
    do {
      uVar8 = uVar8 + 1;
      if (uVar4 <= uVar8) goto LAB_00c9a410;
      fVar11 = *pfVar7;
      pfVar7 = pfVar7 + 0x14;
    } while (fVar11 == pPVar5[uVar3].lbounds.bounds0.lower.field_0.m128[3]);
    uVar6 = 3;
  }
  fVar11 = 0.0;
LAB_00c9a579:
  __return_storage_ptr__->sah = 0.0;
  __return_storage_ptr__->dim = 0;
  (__return_storage_ptr__->field_2).pos = (int)fVar11;
  __return_storage_ptr__->data = uVar6;
  return __return_storage_ptr__;
}

Assistant:

__noinline Split findFallback(const SetMB& set)
          {
            /* split if primitives are not from same geometry */
            if (!sameGeometry(set))
              return Split(0.0f,Split::SPLIT_GEOMID);
            
            /* if a leaf can only hold a single time-segment, we might have to do additional temporal splits */
            if (cfg.singleLeafTimeSegment)
            {
              /* test if one primitive has more than one time segment in time range, if so split time */
              for (size_t i=set.begin(); i<set.end(); i++)
              {
                const PrimRefMB& prim = (*set.prims)[i];
                const range<int> itime_range = prim.timeSegmentRange(set.time_range);
                const int localTimeSegments = itime_range.size();
                assert(localTimeSegments > 0);
                if (localTimeSegments > 1) {
                  const int icenter = (itime_range.begin() + itime_range.end())/2;
                  const float splitTime = prim.timeStep(icenter);
                  return Split(0.0f,(unsigned)Split::SPLIT_TEMPORAL,0,splitTime);
                }
              }
            }        

            /* otherwise return fallback split */
            return Split(0.0f,Split::SPLIT_FALLBACK);
          }